

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

bool __thiscall bitfoot::Bitfoot::AttackedBy<true>(Bitfoot *this,int sqr)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((uint)sqr < 0x40) {
    uVar2 = (ulong)(uint)sqr;
    bVar4 = true;
    if ((((*(ulong *)(_PAWN_ATK + uVar2 * 8) & this->pc[3]) == 0) &&
        ((*(ulong *)(_KNIGHT_ATK + uVar2 * 8) & this->pc[5]) == 0)) &&
       ((*(ulong *)(_KING_ATK + uVar2 * 8) & this->pc[0xd]) == 0)) {
      uVar3 = this->pc[9] | this->pc[0xb];
      uVar2 = (this->pc[1] | this->pc[0]) & *(ulong *)(_NORTH + uVar2 * 8);
      if ((-uVar2 & uVar3 & uVar2) == 0) {
        uVar2 = this->pc[0xb] | this->pc[7];
        uVar1 = EastX(this,sqr);
        if ((uVar1 & uVar3) == 0) {
          uVar1 = NorthEastX(this,sqr);
          if ((uVar1 & uVar2) == 0) {
            uVar1 = NorthWestX(this,sqr);
            if ((uVar1 & uVar2) == 0) {
              uVar1 = WestX(this,sqr);
              if ((uVar1 & uVar3) == 0) {
                uVar1 = SouthX(this,sqr);
                if ((uVar1 & uVar3) == 0) {
                  uVar1 = SouthEastX(this,sqr);
                  if ((uVar1 & uVar2) == 0) {
                    uVar1 = SouthWestX(this,sqr);
                    bVar4 = (uVar1 & uVar2) != 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    return bVar4;
  }
  __assert_fail("IS_SQUARE(sqr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,0x2b6,"bool bitfoot::Bitfoot::AttackedBy(const int) const [color = true]");
}

Assistant:

inline bool AttackedBy(const int sqr) const {
    assert(IS_SQUARE(sqr));
    const uint64_t BQ = (pc[color|Bishop] | pc[color|Queen]);
    const uint64_t RQ = (pc[color|Rook] | pc[color|Queen]);
    return ((_PAWN_ATK[!color][sqr] & pc[color|Pawn]) ||
            (_KNIGHT_ATK[sqr] & pc[color|Knight]) ||
            (_KING_ATK[sqr] & pc[color|King]) ||
            (NorthX(sqr) & RQ) ||
            (EastX(sqr) & RQ) ||
            (NorthEastX(sqr) & BQ) ||
            (NorthWestX(sqr) & BQ) ||
            (WestX(sqr) & RQ) ||
            (SouthX(sqr) & RQ) ||
            (SouthEastX(sqr) & BQ) ||
            (SouthWestX(sqr) & BQ));
  }